

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.c
# Opt level: O3

void av1_lowbd_fwd_txfm2d_8x16_sse2
               (int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  int32_t *piVar1;
  byte bVar2;
  code *pcVar3;
  code *pcVar4;
  undefined8 uVar5;
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  bool bVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  undefined7 in_register_00000009;
  long lVar18;
  bool bVar19;
  undefined8 *puVar20;
  undefined4 uVar21;
  undefined1 auVar23 [12];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined4 uVar28;
  undefined1 auVar30 [12];
  undefined1 auVar31 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar44 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar53 [16];
  undefined1 auVar57 [16];
  undefined4 uVar58;
  undefined1 auVar60 [12];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar70 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined4 uVar75;
  undefined1 auVar77 [12];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar84 [16];
  __m128i buf0 [16];
  __m128i buf1 [16];
  undefined8 local_248;
  byte *local_240;
  undefined8 local_238 [2];
  undefined2 local_228;
  undefined2 uStack_226;
  undefined2 uStack_224;
  undefined2 uStack_222;
  undefined2 uStack_220;
  undefined2 uStack_21e;
  undefined2 uStack_21c;
  undefined2 uStack_21a;
  undefined1 local_218 [16];
  undefined2 local_208;
  undefined2 uStack_206;
  undefined2 uStack_204;
  undefined2 uStack_202;
  undefined2 uStack_200;
  undefined2 uStack_1fe;
  undefined2 uStack_1fc;
  undefined2 uStack_1fa;
  undefined1 local_1f8 [14];
  undefined2 local_1e8;
  undefined2 uStack_1e6;
  undefined2 uStack_1e4;
  undefined2 uStack_1e2;
  undefined2 uStack_1e0;
  undefined2 uStack_1de;
  undefined2 uStack_1dc;
  undefined1 local_1d8 [14];
  undefined2 local_1c8;
  undefined2 uStack_1c6;
  undefined2 uStack_1c4;
  undefined2 uStack_1c2;
  undefined2 uStack_1c0;
  undefined2 uStack_1be;
  undefined2 uStack_1bc;
  undefined1 local_1b8 [16];
  undefined2 local_1a8;
  undefined2 uStack_1a6;
  undefined2 uStack_1a4;
  undefined2 uStack_1a2;
  undefined2 uStack_1a0;
  undefined2 uStack_19e;
  undefined2 uStack_19c;
  undefined2 uStack_19a;
  undefined1 local_198 [16];
  undefined2 local_188;
  undefined2 uStack_186;
  undefined2 uStack_184;
  undefined2 uStack_182;
  undefined2 uStack_180;
  undefined2 uStack_17e;
  undefined2 uStack_17c;
  undefined2 uStack_17a;
  undefined1 local_178 [16];
  undefined2 local_168;
  undefined2 uStack_166;
  undefined2 uStack_164;
  undefined2 uStack_162;
  undefined2 uStack_160;
  undefined2 uStack_15e;
  undefined2 uStack_15c;
  undefined2 uStack_15a;
  undefined1 local_158 [16];
  undefined2 local_148;
  undefined2 uStack_146;
  undefined2 uStack_144;
  undefined2 uStack_142;
  undefined2 uStack_140;
  undefined2 uStack_13e;
  undefined2 uStack_13c;
  undefined2 uStack_13a;
  undefined8 local_138 [4];
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  undefined4 uStack_100;
  undefined4 uStack_fc;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined4 uStack_c0;
  undefined4 uStack_bc;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined1 local_98 [16];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined1 auVar22 [12];
  undefined1 auVar29 [12];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar32 [16];
  undefined1 auVar37 [16];
  undefined1 auVar41 [16];
  undefined1 auVar45 [16];
  undefined1 auVar42 [16];
  undefined1 auVar46 [16];
  undefined1 auVar43 [16];
  undefined1 auVar47 [16];
  undefined1 auVar50 [16];
  undefined1 auVar54 [16];
  undefined1 auVar51 [16];
  undefined1 auVar55 [16];
  undefined1 auVar52 [16];
  undefined1 auVar56 [16];
  undefined1 auVar59 [12];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar68 [16];
  undefined1 auVar71 [16];
  undefined1 auVar69 [16];
  undefined1 auVar72 [16];
  undefined1 auVar76 [12];
  undefined1 auVar78 [16];
  undefined1 auVar82 [16];
  undefined1 auVar85 [16];
  undefined1 auVar83 [16];
  undefined1 auVar86 [16];
  
  local_240 = (byte *)av1_fwd_txfm_shift_ls[7];
  uVar17 = (uint)CONCAT71(in_register_00000009,tx_type);
  local_248._4_4_ = 0;
  if (uVar17 < 0x10) {
    if ((0x4110U >> (uVar17 & 0x1f) & 1) != 0) {
LAB_004b4e2f:
      lVar18 = 0x100;
      do {
        uVar5 = *(undefined8 *)(input + 4);
        *(undefined8 *)((long)&local_248 + lVar18) = *(undefined8 *)input;
        *(undefined8 *)((long)&local_240 + lVar18) = uVar5;
        input = input + stride;
        lVar18 = lVar18 + -0x10;
      } while (lVar18 != 0);
      goto LAB_004b4e4c;
    }
    if ((0x80a0U >> (uVar17 & 0x1f) & 1) == 0) {
      if (uVar17 == 6) {
        local_248._4_4_ = 1;
        goto LAB_004b4e2f;
      }
    }
    else {
      local_248._4_4_ = 1;
    }
  }
  lVar18 = 0;
  do {
    uVar5 = *(undefined8 *)(input + 4);
    *(undefined8 *)((long)local_238 + lVar18) = *(undefined8 *)input;
    *(undefined8 *)((long)local_238 + lVar18 + 8) = uVar5;
    lVar18 = lVar18 + 0x10;
    input = input + stride;
  } while (lVar18 != 0x100);
LAB_004b4e4c:
  pcVar3 = *(code **)((long)col_txfm8x16_arr + (ulong)(uVar17 * 8));
  bVar2 = *local_240;
  uVar16 = (uint)(char)bVar2;
  if ((int)uVar16 < 0) {
    auVar31 = ZEXT416((uint)(1 << (~bVar2 & 0x1f)));
    auVar31 = pshuflw(auVar31,auVar31,0);
    auVar31._4_4_ = auVar31._0_4_;
    auVar31._8_4_ = auVar31._0_4_;
    auVar31._12_4_ = auVar31._0_4_;
    lVar18 = 0;
    do {
      auVar39 = paddsw(*(undefined1 (*) [16])((long)local_238 + lVar18),auVar31);
      auVar39 = psraw(auVar39,ZEXT416(-uVar16));
      *(undefined1 (*) [16])((long)local_238 + lVar18) = auVar39;
      lVar18 = lVar18 + 0x10;
    } while (lVar18 != 0x100);
  }
  else if (bVar2 != 0) {
    lVar18 = 0;
    do {
      auVar31 = psllw(*(undefined1 (*) [16])((long)local_238 + lVar18),ZEXT416(uVar16));
      *(undefined1 (*) [16])((long)local_238 + lVar18) = auVar31;
      lVar18 = lVar18 + 0x10;
    } while (lVar18 != 0x100);
  }
  pcVar4 = *(code **)((long)row_txfm8x8_arr + (ulong)(uVar17 * 8));
  (*pcVar3)(local_238,local_238,0xd);
  bVar2 = local_240[1];
  uVar17 = (uint)(char)bVar2;
  if ((int)uVar17 < 0) {
    auVar31 = ZEXT416((uint)(1 << (~bVar2 & 0x1f)));
    auVar31 = pshuflw(auVar31,auVar31,0);
    auVar39._0_4_ = auVar31._0_4_;
    auVar39._4_4_ = auVar39._0_4_;
    auVar39._8_4_ = auVar39._0_4_;
    auVar39._12_4_ = auVar39._0_4_;
    lVar18 = 0;
    do {
      auVar31 = paddsw(*(undefined1 (*) [16])((long)local_238 + lVar18),auVar39);
      auVar31 = psraw(auVar31,ZEXT416(-uVar17));
      *(undefined1 (*) [16])((long)local_238 + lVar18) = auVar31;
      lVar18 = lVar18 + 0x10;
    } while (lVar18 != 0x100);
  }
  else if (bVar2 != 0) {
    lVar18 = 0;
    do {
      auVar31 = psllw(*(undefined1 (*) [16])((long)local_238 + lVar18),ZEXT416(uVar17));
      *(undefined1 (*) [16])((long)local_238 + lVar18) = auVar31;
      lVar18 = lVar18 + 0x10;
    } while (lVar18 != 0x100);
  }
  auVar43._0_12_ = local_238._0_12_;
  auVar43._12_2_ = local_238[0]._6_2_;
  auVar43._14_2_ = uStack_222;
  auVar42._12_4_ = auVar43._12_4_;
  auVar42._0_10_ = local_238._0_10_;
  auVar42._10_2_ = uStack_224;
  auVar41._10_6_ = auVar42._10_6_;
  auVar41._0_8_ = local_238[0];
  auVar41._8_2_ = local_238[0]._4_2_;
  auVar6._4_8_ = auVar41._8_8_;
  auVar6._2_2_ = uStack_226;
  auVar6._0_2_ = local_238[0]._2_2_;
  auVar40._0_4_ = CONCAT22(local_228,(short)local_238[0]);
  auVar40._4_12_ = auVar6;
  auVar69._0_12_ = local_218._0_12_;
  auVar69._12_2_ = local_218._6_2_;
  auVar69._14_2_ = uStack_202;
  auVar68._12_4_ = auVar69._12_4_;
  auVar68._0_10_ = local_218._0_10_;
  auVar68._10_2_ = uStack_204;
  auVar67._10_6_ = auVar68._10_6_;
  auVar67._0_8_ = local_218._0_8_;
  auVar67._8_2_ = local_218._4_2_;
  auVar7._4_8_ = auVar67._8_8_;
  auVar7._2_2_ = uStack_206;
  auVar7._0_2_ = local_218._2_2_;
  auVar52._0_12_ = local_1f8._0_12_;
  auVar52._12_2_ = local_1f8._6_2_;
  auVar52._14_2_ = uStack_1e2;
  auVar51._12_4_ = auVar52._12_4_;
  auVar51._0_10_ = local_1f8._0_10_;
  auVar51._10_2_ = uStack_1e4;
  auVar50._10_6_ = auVar51._10_6_;
  auVar50._0_8_ = local_1f8._0_8_;
  auVar50._8_2_ = local_1f8._4_2_;
  auVar8._4_8_ = auVar50._8_8_;
  auVar8._2_2_ = uStack_1e6;
  auVar8._0_2_ = local_1f8._2_2_;
  auVar49._0_4_ = CONCAT22(local_1e8,local_1f8._0_2_);
  auVar49._4_12_ = auVar8;
  auVar83._0_12_ = local_1d8._0_12_;
  auVar83._12_2_ = local_1d8._6_2_;
  auVar83._14_2_ = uStack_1c2;
  auVar82._12_4_ = auVar83._12_4_;
  auVar82._0_10_ = local_1d8._0_10_;
  auVar82._10_2_ = uStack_1c4;
  auVar81._10_6_ = auVar82._10_6_;
  auVar81._0_8_ = local_1d8._0_8_;
  auVar81._8_2_ = local_1d8._4_2_;
  auVar9._4_8_ = auVar81._8_8_;
  auVar9._2_2_ = uStack_1c6;
  auVar9._0_2_ = local_1d8._2_2_;
  uVar21 = CONCAT22(uStack_220,(short)local_238[1]);
  auVar22._0_8_ = CONCAT26(uStack_21e,CONCAT24(local_238[1]._2_2_,uVar21));
  auVar22._8_2_ = local_238[1]._4_2_;
  auVar22._10_2_ = uStack_21c;
  auVar25._12_2_ = local_238[1]._6_2_;
  auVar25._0_12_ = auVar22;
  auVar25._14_2_ = uStack_21a;
  uVar58 = CONCAT22(uStack_200,local_218._8_2_);
  auVar59._0_8_ = CONCAT26(uStack_1fe,CONCAT24(local_218._10_2_,uVar58));
  auVar59._8_2_ = local_218._12_2_;
  auVar59._10_2_ = uStack_1fc;
  auVar61._12_2_ = local_218._14_2_;
  auVar61._0_12_ = auVar59;
  auVar61._14_2_ = uStack_1fa;
  uVar28 = CONCAT22(uStack_1e0,local_1f8._8_2_);
  auVar29._0_8_ = CONCAT26(uStack_1de,CONCAT24(local_1f8._10_2_,uVar28));
  auVar29._8_2_ = local_1f8._12_2_;
  auVar29._10_2_ = uStack_1dc;
  uVar75 = CONCAT22(uStack_1c0,local_1d8._8_2_);
  auVar76._0_8_ = CONCAT26(uStack_1be,CONCAT24(local_1d8._10_2_,uVar75));
  auVar76._8_2_ = local_1d8._12_2_;
  auVar76._10_2_ = uStack_1bc;
  auVar63._0_8_ = auVar40._0_8_;
  auVar63._8_4_ = auVar6._0_4_;
  auVar63._12_4_ = auVar7._0_4_;
  auVar65._0_8_ = auVar49._0_8_;
  auVar65._8_4_ = auVar8._0_4_;
  auVar65._12_4_ = auVar9._0_4_;
  auVar73._8_4_ = (int)((ulong)auVar22._0_8_ >> 0x20);
  auVar73._0_8_ = auVar22._0_8_;
  auVar73._12_4_ = (int)((ulong)auVar59._0_8_ >> 0x20);
  auVar79._8_4_ = (int)((ulong)auVar29._0_8_ >> 0x20);
  auVar79._0_8_ = auVar29._0_8_;
  auVar79._12_4_ = (int)((ulong)auVar76._0_8_ >> 0x20);
  local_138[0] = CONCAT44(CONCAT22(local_208,local_218._0_2_),auVar40._0_4_);
  local_138[1] = CONCAT44(CONCAT22(local_1c8,local_1d8._0_2_),auVar49._0_4_);
  local_138[2] = auVar63._8_8_;
  local_138[3] = auVar65._8_8_;
  local_118 = auVar41._8_4_;
  uStack_114 = auVar67._8_4_;
  uStack_110 = auVar50._8_4_;
  uStack_10c = auVar81._8_4_;
  uStack_100 = auVar42._12_4_;
  uStack_fc = auVar68._12_4_;
  local_f8 = CONCAT44(uVar58,uVar21);
  uStack_f0 = CONCAT44(uVar75,uVar28);
  local_e8 = auVar73._8_8_;
  uStack_e0 = auVar79._8_8_;
  local_d8 = auVar22._8_4_;
  uStack_d4 = auVar59._8_4_;
  uStack_d0 = auVar29._8_4_;
  uStack_cc = auVar76._8_4_;
  uStack_c0 = auVar25._12_4_;
  uStack_bc = auVar61._12_4_;
  auVar47._0_12_ = local_1b8._0_12_;
  auVar47._12_2_ = local_1b8._6_2_;
  auVar47._14_2_ = uStack_1a2;
  auVar46._12_4_ = auVar47._12_4_;
  auVar46._0_10_ = local_1b8._0_10_;
  auVar46._10_2_ = uStack_1a4;
  auVar45._10_6_ = auVar46._10_6_;
  auVar45._0_8_ = local_1b8._0_8_;
  auVar45._8_2_ = local_1b8._4_2_;
  auVar10._4_8_ = auVar45._8_8_;
  auVar10._2_2_ = uStack_1a6;
  auVar10._0_2_ = local_1b8._2_2_;
  auVar44._0_4_ = CONCAT22(local_1a8,local_1b8._0_2_);
  auVar44._4_12_ = auVar10;
  auVar72._0_12_ = local_198._0_12_;
  auVar72._12_2_ = local_198._6_2_;
  auVar72._14_2_ = uStack_182;
  auVar71._12_4_ = auVar72._12_4_;
  auVar71._0_10_ = local_198._0_10_;
  auVar71._10_2_ = uStack_184;
  auVar70._10_6_ = auVar71._10_6_;
  auVar70._0_8_ = local_198._0_8_;
  auVar70._8_2_ = local_198._4_2_;
  auVar11._4_8_ = auVar70._8_8_;
  auVar11._2_2_ = uStack_186;
  auVar11._0_2_ = local_198._2_2_;
  auVar56._0_12_ = local_178._0_12_;
  auVar56._12_2_ = local_178._6_2_;
  auVar56._14_2_ = uStack_162;
  auVar55._12_4_ = auVar56._12_4_;
  auVar55._0_10_ = local_178._0_10_;
  auVar55._10_2_ = uStack_164;
  auVar54._10_6_ = auVar55._10_6_;
  auVar54._0_8_ = local_178._0_8_;
  auVar54._8_2_ = local_178._4_2_;
  auVar12._4_8_ = auVar54._8_8_;
  auVar12._2_2_ = uStack_166;
  auVar12._0_2_ = local_178._2_2_;
  auVar53._0_4_ = CONCAT22(local_168,local_178._0_2_);
  auVar53._4_12_ = auVar12;
  auVar86._0_12_ = local_158._0_12_;
  auVar86._12_2_ = local_158._6_2_;
  auVar86._14_2_ = uStack_142;
  auVar85._12_4_ = auVar86._12_4_;
  auVar85._0_10_ = local_158._0_10_;
  auVar85._10_2_ = uStack_144;
  auVar84._10_6_ = auVar85._10_6_;
  auVar84._0_8_ = local_158._0_8_;
  auVar84._8_2_ = local_158._4_2_;
  auVar13._4_8_ = auVar84._8_8_;
  auVar13._2_2_ = uStack_146;
  auVar13._0_2_ = local_158._2_2_;
  uVar21 = CONCAT22(uStack_1a0,local_1b8._8_2_);
  auVar23._0_8_ = CONCAT26(uStack_19e,CONCAT24(local_1b8._10_2_,uVar21));
  auVar23._8_2_ = local_1b8._12_2_;
  auVar23._10_2_ = uStack_19c;
  auVar38._12_2_ = local_1b8._14_2_;
  auVar38._0_12_ = auVar23;
  auVar38._14_2_ = uStack_19a;
  uVar58 = CONCAT22(uStack_180,local_198._8_2_);
  auVar60._0_8_ = CONCAT26(uStack_17e,CONCAT24(local_198._10_2_,uVar58));
  auVar60._8_2_ = local_198._12_2_;
  auVar60._10_2_ = uStack_17c;
  auVar62._12_2_ = local_198._14_2_;
  auVar62._0_12_ = auVar60;
  auVar62._14_2_ = uStack_17a;
  uVar28 = CONCAT22(uStack_160,local_178._8_2_);
  auVar30._0_8_ = CONCAT26(uStack_15e,CONCAT24(local_178._10_2_,uVar28));
  auVar30._8_2_ = local_178._12_2_;
  auVar30._10_2_ = uStack_15c;
  auVar32._12_2_ = local_178._14_2_;
  auVar32._0_12_ = auVar30;
  auVar32._14_2_ = uStack_15a;
  uVar75 = CONCAT22(uStack_140,local_158._8_2_);
  auVar77._0_8_ = CONCAT26(uStack_13e,CONCAT24(local_158._10_2_,uVar75));
  auVar77._8_2_ = local_158._12_2_;
  auVar77._10_2_ = uStack_13c;
  auVar78._12_2_ = local_158._14_2_;
  auVar78._0_12_ = auVar77;
  auVar78._14_2_ = uStack_13a;
  auVar64._0_8_ = auVar44._0_8_;
  auVar64._8_4_ = auVar10._0_4_;
  auVar64._12_4_ = auVar11._0_4_;
  auVar66._0_8_ = auVar53._0_8_;
  auVar66._8_4_ = auVar12._0_4_;
  auVar66._12_4_ = auVar13._0_4_;
  auVar74._8_4_ = (int)((ulong)auVar23._0_8_ >> 0x20);
  auVar74._0_8_ = auVar23._0_8_;
  auVar74._12_4_ = (int)((ulong)auVar60._0_8_ >> 0x20);
  auVar80._8_4_ = (int)((ulong)auVar30._0_8_ >> 0x20);
  auVar80._0_8_ = auVar30._0_8_;
  auVar80._12_4_ = (int)((ulong)auVar77._0_8_ >> 0x20);
  auVar48._0_8_ = CONCAT44(auVar70._8_4_,auVar45._8_4_);
  auVar48._8_4_ = auVar46._12_4_;
  auVar48._12_4_ = auVar71._12_4_;
  auVar57._0_8_ = CONCAT44(auVar84._8_4_,auVar54._8_4_);
  auVar57._8_4_ = auVar55._12_4_;
  auVar57._12_4_ = auVar85._12_4_;
  auVar24._0_8_ = CONCAT44(auVar60._8_4_,auVar23._8_4_);
  auVar24._8_4_ = auVar38._12_4_;
  auVar24._12_4_ = auVar62._12_4_;
  auVar33._0_8_ = CONCAT44(auVar77._8_4_,auVar30._8_4_);
  auVar33._8_4_ = auVar32._12_4_;
  auVar33._12_4_ = auVar78._12_4_;
  local_b8 = CONCAT44(CONCAT22(local_188,local_198._0_2_),auVar44._0_4_);
  uStack_b0 = CONCAT44(CONCAT22(local_148,local_158._0_2_),auVar53._0_4_);
  local_a8 = auVar64._8_8_;
  uStack_a0 = auVar66._8_8_;
  local_98._8_8_ = auVar57._0_8_;
  local_98._0_8_ = auVar48._0_8_;
  local_88 = auVar48._8_8_;
  uStack_80 = auVar57._8_8_;
  local_78 = CONCAT44(uVar58,uVar21);
  uStack_70 = CONCAT44(uVar75,uVar28);
  local_68 = auVar74._8_8_;
  uStack_60 = auVar80._8_8_;
  local_58._8_8_ = auVar33._0_8_;
  local_58._0_8_ = auVar24._0_8_;
  local_48 = auVar24._8_8_;
  uStack_40 = auVar33._8_8_;
  lVar18 = 0;
  bVar14 = true;
  do {
    bVar19 = bVar14;
    puVar20 = local_138 + lVar18 * 0x10;
    if (local_248._4_4_ != 0) {
      lVar15 = 0x80;
      do {
        uVar5 = puVar20[1];
        *(undefined8 *)((long)&local_248 + lVar15) = *puVar20;
        *(undefined8 *)((long)&local_240 + lVar15) = uVar5;
        puVar20 = puVar20 + 2;
        lVar15 = lVar15 + -0x10;
      } while (lVar15 != 0);
      puVar20 = local_238;
    }
    (*pcVar4)(puVar20,puVar20,0xd);
    auVar39 = _DAT_00562cc0;
    auVar31 = _DAT_0055f800;
    bVar2 = local_240[2];
    uVar17 = (uint)(char)bVar2;
    if ((int)uVar17 < 0) {
      auVar25 = ZEXT416((uint)(1 << (~bVar2 & 0x1f)));
      auVar25 = pshuflw(auVar25,auVar25,0);
      auVar26._0_4_ = auVar25._0_4_;
      auVar26._4_4_ = auVar26._0_4_;
      auVar26._8_4_ = auVar26._0_4_;
      auVar26._12_4_ = auVar26._0_4_;
      lVar15 = 0;
      do {
        auVar25 = paddsw(*(undefined1 (*) [16])((long)puVar20 + lVar15),auVar26);
        auVar25 = psraw(auVar25,ZEXT416(-uVar17));
        *(undefined1 (*) [16])((long)puVar20 + lVar15) = auVar25;
        lVar15 = lVar15 + 0x10;
      } while (lVar15 != 0x80);
    }
    else if (bVar2 != 0) {
      lVar15 = 0;
      do {
        auVar25 = psllw(*(undefined1 (*) [16])((long)puVar20 + lVar15),ZEXT416(uVar17));
        *(undefined1 (*) [16])((long)puVar20 + lVar15) = auVar25;
        lVar15 = lVar15 + 0x10;
      } while (lVar15 != 0x80);
    }
    lVar15 = 0;
    do {
      auVar25 = *(undefined1 (*) [16])((long)puVar20 + lVar15);
      auVar37._0_12_ = auVar25._0_12_;
      auVar37._12_2_ = auVar25._6_2_;
      auVar37._14_2_ = auVar31._6_2_;
      auVar36._12_4_ = auVar37._12_4_;
      auVar36._0_10_ = auVar25._0_10_;
      auVar36._10_2_ = auVar31._4_2_;
      auVar35._10_6_ = auVar36._10_6_;
      auVar35._0_8_ = auVar25._0_8_;
      auVar35._8_2_ = auVar25._4_2_;
      auVar34._8_8_ = auVar35._8_8_;
      auVar34._6_2_ = auVar31._2_2_;
      auVar34._4_2_ = auVar25._2_2_;
      auVar34._0_2_ = auVar25._0_2_;
      auVar34._2_2_ = auVar31._0_2_;
      auVar27._2_2_ = 1;
      auVar27._0_2_ = auVar25._8_2_;
      auVar27._4_2_ = auVar25._10_2_;
      auVar27._6_2_ = 1;
      auVar27._8_2_ = auVar25._12_2_;
      auVar27._10_2_ = 1;
      auVar27._12_2_ = auVar25._14_2_;
      auVar27._14_2_ = 1;
      auVar38 = pmaddwd(auVar34,auVar39);
      auVar25 = pmaddwd(auVar27,auVar39);
      piVar1 = output + lVar18 * 8 + lVar15;
      *piVar1 = auVar38._0_4_ >> 0xc;
      piVar1[1] = auVar38._4_4_ >> 0xc;
      piVar1[2] = auVar38._8_4_ >> 0xc;
      piVar1[3] = auVar38._12_4_ >> 0xc;
      piVar1 = output + lVar18 * 8 + lVar15 + 4;
      *piVar1 = auVar25._0_4_ >> 0xc;
      piVar1[1] = auVar25._4_4_ >> 0xc;
      piVar1[2] = auVar25._8_4_ >> 0xc;
      piVar1[3] = auVar25._12_4_ >> 0xc;
      lVar15 = lVar15 + 0x10;
    } while (lVar15 != 0x80);
    lVar18 = 1;
    bVar14 = false;
  } while (bVar19);
  return;
}

Assistant:

void av1_lowbd_fwd_txfm2d_8x16_sse2(const int16_t *input, int32_t *output,
                                    int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  __m128i buf0[16], buf1[16];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_8X16];
  const int txw_idx = get_txw_idx(TX_8X16);
  const int txh_idx = get_txh_idx(TX_8X16);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = 8;
  const int height = 16;
  const transform_1d_sse2 col_txfm = col_txfm8x16_arr[tx_type];
  const transform_1d_sse2 row_txfm = row_txfm8x8_arr[tx_type];
  int ud_flip, lr_flip;

  get_flip_cfg(tx_type, &ud_flip, &lr_flip);
  if (ud_flip) {
    load_buffer_16bit_to_16bit_flip(input, stride, buf0, height);
  } else {
    load_buffer_16bit_to_16bit(input, stride, buf0, height);
  }
  round_shift_16bit(buf0, height, shift[0]);
  col_txfm(buf0, buf0, cos_bit_col);
  round_shift_16bit(buf0, height, shift[1]);
  transpose_16bit_8x8(buf0, buf1);
  transpose_16bit_8x8(buf0 + 8, buf1 + 8);

  for (int i = 0; i < 2; i++) {
    __m128i *buf;
    if (lr_flip) {
      buf = buf0;
      flip_buf_sse2(buf1 + width * i, buf, width);
    } else {
      buf = buf1 + width * i;
    }
    row_txfm(buf, buf, cos_bit_row);
    round_shift_16bit(buf, width, shift[2]);
    store_rect_buffer_16bit_to_32bit_w8(buf, output + 8 * i, height, width);
  }
}